

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfiledialog.cpp
# Opt level: O0

int __thiscall QFileDialog::qt_metacall(QFileDialog *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  void **in_stack_000000a8;
  int in_stack_000000b0;
  Call in_stack_000000b4;
  QObject *in_stack_000000b8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = QDialog::qt_metacall
                    ((QDialog *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (Call)((ulong)in_RDI >> 0x20),(int)in_RDI,(void **)CONCAT44(in_ESI,in_EDX));
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 9) {
        qt_static_metacall(in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8);
      }
      iVar1 = iVar1 + -9;
    }
    if (in_ESI == 7) {
      if (iVar1 < 9) {
        qt_static_metacall(in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8);
      }
      iVar1 = iVar1 + -9;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8);
      iVar1 = iVar1 + -6;
    }
  }
  return iVar1;
}

Assistant:

int QFileDialog::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDialog::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 9)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 9;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 9)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 9;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 6;
    }
    return _id;
}